

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpndrv.h
# Opt level: O2

void __thiscall CTcSymPropBase::~CTcSymPropBase(CTcSymPropBase *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

CTcSymPropBase(const char *str, size_t len, int copy,
                   tctarg_prop_id_t prop)
        : CTcSymbol(str, len, copy, TC_SYM_PROP)
    {
        /* remember our property ID */
        prop_ = prop;

        /* we're not referenced yet */
        ref_ = FALSE;

        /* presume it's not a vocabulary property */
        vocab_ = FALSE;

        /* presume it's not a weak property assumption */
        weak_ = FALSE;
    }